

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O2

void senjo::BackgroundCommand::Run(void *data)

{
  Output local_20;
  
  if (data == (void *)0x0) {
    Output::Output(&local_20,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"BackgroundCommand::Run() NULL data parameter");
    Output::~Output(&local_20);
  }
  else {
    (**(code **)(*data + 0x30))(data);
    (**(code **)(*data + 8))(data);
  }
  return;
}

Assistant:

void BackgroundCommand::Run(void* data)
{
  BackgroundCommand* cmd = NULL;
  try {
    if (!data) {
      Output() << "BackgroundCommand::Run() NULL data parameter";
      return;
    }

#ifdef NDEBUG
    cmd = static_cast<BackgroundCommand*>(data);
#else
    cmd = reinterpret_cast<BackgroundCommand*>(data);
    if (!cmd) {
      // NOTE: potential memory leak if this happens
      Output() << "BackgroundCommand::Run() failed to cast data parameter";
      return;
    }
#endif

    cmd->Execute();
  }
  catch (const std::exception& e) {
    std::cerr << "BackgrounThread::Run() ERROR: "
              << e.what() << std::endl;
  }
  catch (...) {
    std::cerr << "BackgrounThread::Run() ERROR: unknown exception"
              << std::endl;
  }

  if (cmd) {
    delete cmd;
    cmd = NULL;
  }
}